

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsErrorCode
WScriptJsrt::FetchImportedModuleHelper
          (JsModuleRecord referencingModule,JsValueRef specifier,
          JsModuleRecord *dependentModuleRecord,LPCSTR refdir)

{
  MessageQueue *this;
  JsErrorCode JVar1;
  DWORD DVar2;
  size_t sVar3;
  char *pcVar4;
  iterator iVar5;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar6;
  mapped_type *pmVar7;
  ModuleMessage *pMVar8;
  char local_1c8 [8];
  char fullPath [260];
  ListEntry local_b8;
  undefined1 auStack_a8 [8];
  AutoString specifierStr;
  size_type *local_80;
  string specifierFullPath;
  undefined1 local_58 [8];
  string pathKey;
  JsModuleRecord moduleRecord;
  
  pathKey.field_2._8_8_ = 0;
  specifierStr.data._0_5_ = 0;
  specifierStr._13_8_ = 0;
  auStack_a8 = (undefined1  [8])0x0;
  specifierStr.length._0_5_ = 0;
  specifierStr.length._5_3_ = 0;
  *dependentModuleRecord = (JsModuleRecord)0x0;
  JVar1 = AutoString::Initialize((AutoString *)auStack_a8,specifier);
  if (JVar1 == JsNoError) {
    pcVar4 = "";
    if (refdir != (LPCSTR)0x0) {
      pcVar4 = refdir;
    }
    local_80 = &specifierFullPath._M_string_length;
    sVar3 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::append((char *)&local_80);
    pcVar4 = _fullpath(local_1c8,(char *)local_80,0x104);
    if (pcVar4 == (char *)0x0) {
      JVar1 = JsErrorInvalidArgument;
    }
    else {
      local_58 = (undefined1  [8])&pathKey._M_string_length;
      sVar3 = strlen(local_1c8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,local_1c8,local_1c8 + sVar3);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::find(&moduleRecordMap_abi_cxx11_._M_t,(key_type *)local_58);
      if (local_58 != (undefined1  [8])&pathKey._M_string_length) {
        operator_delete((void *)local_58);
      }
      if ((_Rb_tree_header *)iVar5._M_node ==
          &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtInitializeModuleRecord)
                          (referencingModule,specifier,
                           (JsModuleRecord *)((long)&pathKey.field_2 + 8));
        if (JVar1 == JsNoError) {
          fullDirNarrow =
               std::
               map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&moduleDirMap_abi_cxx11_,(key_type *)((long)&pathKey.field_2 + 8));
          GetDir(local_1c8,fullDirNarrow);
          local_58 = (undefined1  [8])&pathKey._M_string_length;
          sVar3 = strlen(local_1c8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,local_1c8,local_1c8 + sVar3);
          specifierFullPath.field_2._8_8_ = pathKey.field_2._8_8_;
          ppvVar6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                    ::operator[](&moduleRecordMap_abi_cxx11_,(key_type *)local_58);
          *ppvVar6 = (mapped_type)specifierFullPath.field_2._8_8_;
          pmVar7 = std::
                   map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                   ::operator[](&moduleErrMap,(key_type *)((long)&pathKey.field_2 + 8));
          *pmVar7 = ImportedModule;
          pMVar8 = ModuleMessage::Create(referencingModule,specifier,(string *)local_58);
          this = messageQueue;
          if (pMVar8 == (ModuleMessage *)0x0) {
            if (local_58 != (undefined1  [8])&pathKey._M_string_length) {
              operator_delete((void *)local_58);
            }
            JVar1 = JsErrorOutOfMemory;
          }
          else {
            DVar2 = GetTickCount();
            local_b8.time = DVar2 + (pMVar8->super_MessageBase).m_time;
            (pMVar8->super_MessageBase).m_time = local_b8.time;
            local_b8.message = &pMVar8->super_MessageBase;
            SortedList<MessageQueue::ListEntry>::Insert(&this->m_queue,&local_b8);
            *dependentModuleRecord = (JsModuleRecord)pathKey.field_2._8_8_;
            if (local_58 != (undefined1  [8])&pathKey._M_string_length) {
              operator_delete((void *)local_58);
            }
          }
        }
      }
      else {
        *dependentModuleRecord = *(JsModuleRecord *)(iVar5._M_node + 2);
        JVar1 = JsNoError;
      }
    }
    if (local_80 != &specifierFullPath._M_string_length) {
      operator_delete(local_80);
    }
  }
  else {
    JVar1 = (JsErrorCode)specifierStr.data_wide;
  }
  AutoString::~AutoString((AutoString *)auStack_a8);
  return JVar1;
}

Assistant:

JsErrorCode WScriptJsrt::FetchImportedModuleHelper(JsModuleRecord referencingModule,
    JsValueRef specifier, __out JsModuleRecord* dependentModuleRecord, LPCSTR refdir)
{
    JsModuleRecord moduleRecord = JS_INVALID_REFERENCE;
    AutoString specifierStr;
    *dependentModuleRecord = nullptr;

    if (specifierStr.Initialize(specifier) != JsNoError)
    {
        return specifierStr.GetError();
    }

    char fullPath[_MAX_PATH];
    std::string specifierFullPath = refdir ? refdir : "";
    specifierFullPath += *specifierStr;
    if (_fullpath(fullPath, specifierFullPath.c_str(), _MAX_PATH) == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    auto moduleEntry = moduleRecordMap.find(std::string(fullPath));
    if (moduleEntry != moduleRecordMap.end())
    {
        *dependentModuleRecord = moduleEntry->second;
        return JsNoError;
    }

    JsErrorCode errorCode = ChakraRTInterface::JsInitializeModuleRecord(referencingModule, specifier, &moduleRecord);
    if (errorCode == JsNoError)
    {
        GetDir(fullPath, &moduleDirMap[moduleRecord]);
        std::string pathKey = std::string(fullPath);
        moduleRecordMap[pathKey] = moduleRecord;
        moduleErrMap[moduleRecord] = ImportedModule;
        ModuleMessage* moduleMessage = WScriptJsrt::ModuleMessage::Create(referencingModule, specifier, &pathKey);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
        *dependentModuleRecord = moduleRecord;
    }
    return errorCode;
}